

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootwindow.cpp
# Opt level: O0

Node * __thiscall RootWindow::build(RootWindow *this)

{
  char *pcVar1;
  bool bVar2;
  GlyphContext *this_00;
  ostream *poVar3;
  OpacityNode *pOVar4;
  LayoutNode *pLVar5;
  Rectangles *this_01;
  LayeredOpacity *this_02;
  BlurExample *this_03;
  ShadowExample *this_04;
  SignalHandler_Function<> *this_05;
  Button *pBVar6;
  socklen_t __len;
  Button *pBVar7;
  float fVar8;
  float fVar9;
  float w;
  float h;
  rect2d rect;
  SignalHandler_Function<> *local_a8;
  undefined1 local_99;
  anon_class_8_1_8991fb9c local_98;
  function<void_()> local_90;
  SignalHandler_Function<> *local_70;
  SignalHandler_Function<> *handler;
  Node *root;
  vec2 windowSize;
  Units units;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  char *fontFile;
  RootWindow *this_local;
  
  local_18 = "OpenSans-Regular.ttf";
  fontFile = (char *)this;
  this_00 = (GlyphContext *)operator_new(0x40);
  pcVar1 = local_18;
  windowSize.y._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  rengine::GlyphContext::GlyphContext(this_00,(string *)local_38);
  windowSize.y._3_1_ = 0;
  this->m_font = this_00;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar2 = rengine::GlyphContext::isValid(this->m_font);
  if (!bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to load \'");
    poVar3 = std::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3,"\'...");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,
                             "The font file needs to be downloaded separately and placed next");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"to the \'demo\' binary.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  bVar2 = rengine::GlyphContext::isValid(this->m_font);
  if (!bVar2) {
    __assert_fail("m_font->isValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp"
                  ,0x2f,"virtual Node *RootWindow::build()");
  }
  rengine::Units::Units((Units *)&windowSize,(Surface *)this);
  unique0x1000051f = rengine::Surface::size((Surface *)this);
  handler = (SignalHandler_Function<> *)rengine::Node::create();
  pOVar4 = rengine::OpacityNode::create();
  this->m_appLayer = pOVar4;
  pLVar5 = rengine::LayoutNode::create();
  this->m_buttonGrid = pLVar5;
  rengine::LayoutNode::setActivationMode(this->m_buttonGrid,Explicit);
  rengine::LayoutNode::setLayoutType(this->m_buttonGrid,Grid_Horizontal);
  pLVar5 = this->m_buttonGrid;
  fVar8 = rengine::Units::base((Units *)&windowSize);
  rengine::LayoutNode::setCellWidth(pLVar5,fVar8 * 15.0);
  pLVar5 = this->m_buttonGrid;
  fVar8 = rengine::Units::base((Units *)&windowSize);
  rengine::LayoutNode::setCellHeight(pLVar5,fVar8 * 3.0);
  pLVar5 = this->m_buttonGrid;
  fVar8 = rengine::Units::base((Units *)&windowSize);
  rengine::LayoutNode::setSpacing(pLVar5,fVar8);
  pLVar5 = this->m_buttonGrid;
  fVar8 = rengine::Units::base((Units *)&windowSize);
  rengine::LayoutNode::setMargin(pLVar5,fVar8);
  rengine::LayoutNode::setColumnCount(this->m_buttonGrid,1);
  pLVar5 = this->m_buttonGrid;
  fVar8 = root._4_4_ * 0.5;
  fVar9 = rengine::LayoutNode::cellWidth(pLVar5);
  rengine::LayoutNode::setX(pLVar5,fVar8 + fVar9 * -0.5);
  this_01 = (Rectangles *)operator_new(0x58);
  (this_01->m_texture)._M_t.
  super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
  super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
  super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl = (Texture *)0x0;
  (this_01->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  *(undefined8 *)&(this_01->super_Example).super_Node.field_0x30 = 0;
  (this_01->super_Example).m_window = (RootWindow *)0x0;
  (this_01->super_Example).super_Node.m_next = (Node *)0x0;
  (this_01->super_Example).super_Node.m_prev = (Node *)0x0;
  (this_01->super_Example).super_Node.m_parent = (Node *)0x0;
  (this_01->super_Example).super_Node.m_child = (Node *)0x0;
  (this_01->super_Example).super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (this_01->super_Example).super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (this_01->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Rectangles::Rectangles(this_01);
  add(this,(Example *)this_01,(Units *)&windowSize);
  this_02 = (LayeredOpacity *)operator_new(0x50);
  (this_02->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_02->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&(this_02->super_Example).super_Node.field_0x30 = 0;
  (this_02->super_Example).m_window = (RootWindow *)0x0;
  (this_02->super_Example).super_Node.m_next = (Node *)0x0;
  (this_02->super_Example).super_Node.m_prev = (Node *)0x0;
  (this_02->super_Example).super_Node.m_parent = (Node *)0x0;
  (this_02->super_Example).super_Node.m_child = (Node *)0x0;
  (this_02->super_Example).super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (this_02->super_Example).super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  LayeredOpacity::LayeredOpacity(this_02);
  add(this,(Example *)this_02,(Units *)&windowSize);
  this_03 = (BlurExample *)operator_new(0x58);
  (this_03->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_03->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&(this_03->super_Example).super_Node.field_0x30 = 0;
  (this_03->super_Example).m_window = (RootWindow *)0x0;
  (this_03->super_Example).super_Node.m_next = (Node *)0x0;
  (this_03->super_Example).super_Node.m_prev = (Node *)0x0;
  (this_03->super_Example).super_Node.m_parent = (Node *)0x0;
  (this_03->super_Example).super_Node.m_child = (Node *)0x0;
  (this_03->super_Example).super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (this_03->super_Example).super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (this_03->m_texture)._M_t.
  super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
  super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
  super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl = (Texture *)0x0;
  BlurExample::BlurExample(this_03);
  add(this,(Example *)this_03,(Units *)&windowSize);
  this_04 = (ShadowExample *)operator_new(0x58);
  (this_04->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_04->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&(this_04->super_Example).super_Node.field_0x30 = 0;
  (this_04->super_Example).m_window = (RootWindow *)0x0;
  (this_04->super_Example).super_Node.m_next = (Node *)0x0;
  (this_04->super_Example).super_Node.m_prev = (Node *)0x0;
  (this_04->super_Example).super_Node.m_parent = (Node *)0x0;
  (this_04->super_Example).super_Node.m_child = (Node *)0x0;
  (this_04->super_Example).super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (this_04->super_Example).super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (this_04->m_texture)._M_t.
  super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
  super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
  super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl = (Texture *)0x0;
  ShadowExample::ShadowExample(this_04);
  add(this,(Example *)this_04,(Units *)&windowSize);
  rengine::LayoutNode::updateLayout(this->m_buttonGrid);
  rengine::Node::append((Node *)handler,&this->m_buttonGrid->super_Node);
  rengine::Node::append((Node *)handler,&this->m_appLayer->super_Node);
  this_05 = (SignalHandler_Function<> *)operator_new(0x28);
  local_99 = 1;
  local_98.this = this;
  std::function<void()>::function<RootWindow::build()::__0,void>
            ((function<void()> *)&local_90,&local_98);
  rengine::SignalHandler_Function<>::SignalHandler_Function(this_05,&local_90);
  local_99 = 0;
  std::function<void_()>::~function(&local_90);
  local_a8 = this_05;
  local_70 = this_05;
  std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::push_back
            (&this->m_buttonSignalHandlers,(value_type *)&local_a8);
  pBVar6 = createTextButton(this,"Close",(Units *)&windowSize);
  this->m_closeButton = pBVar6;
  pBVar6 = this->m_closeButton;
  pBVar7 = pBVar6;
  fVar8 = rengine::LayoutNode::margin(this->m_buttonGrid);
  __len = (socklen_t)pBVar7;
  fVar9 = rengine::LayoutNode::margin(this->m_buttonGrid);
  w = rengine::LayoutNode::cellWidth(this->m_buttonGrid);
  h = rengine::LayoutNode::cellHeight(this->m_buttonGrid);
  rect = rengine::rect2d::fromXywh(fVar8,fVar9,w,h);
  rengine::RectangleNodeBase::setGeometry(&pBVar6->super_RectangleNodeBase,rect);
  rengine::Signal<>::connect(&Button::onClicked,(int)this->m_closeButton,(sockaddr *)local_70,__len)
  ;
  return (Node *)handler;
}

Assistant:

Node *RootWindow::build()
{
    const char *fontFile = "OpenSans-Regular.ttf";
    m_font = new GlyphContext(fontFile);
    if (!m_font->isValid()) {
        cerr << "Failed to load '" << fontFile << "'..." << endl
             << "The font file needs to be downloaded separately and placed next" << endl
             << "to the 'demo' binary." << endl;
    }
    assert(m_font->isValid());

    Units units(this);
    vec2 windowSize = size();

    Node *root = Node::create();

    // Prepare the app layer
    m_appLayer = OpacityNode::create();


    // Prepare the button grid
    m_buttonGrid = LayoutNode::create();
    m_buttonGrid->setActivationMode(LayoutNode::Explicit);
    m_buttonGrid->setLayoutType(LayoutEngine::Grid_Horizontal);
    m_buttonGrid->setCellWidth(units.base() * 15.0f);
    m_buttonGrid->setCellHeight(units.base() * 3.0f);
    m_buttonGrid->setSpacing(units.base() * 1.0f);
    m_buttonGrid->setMargin(units.base() * 1.0f);
    m_buttonGrid->setColumnCount(1);
    m_buttonGrid->setX(windowSize.x / 2 - m_buttonGrid->cellWidth() / 2);

    add(new Rectangles(), units);
    add(new LayeredOpacity(), units);
    add(new BlurExample(), units);
    add(new ShadowExample(), units);

    m_buttonGrid->updateLayout();

    root->append(m_buttonGrid);
    root->append(m_appLayer);

    // The close button..
    SignalHandler_Function<> *handler = new SignalHandler_Function<>([this] () { closeExample(); });
    m_buttonSignalHandlers.push_back(handler);
    m_closeButton = createTextButton("Close", units);
    m_closeButton->setGeometry(rect2d::fromXywh(m_buttonGrid->margin(), m_buttonGrid->margin(),
                                                m_buttonGrid->cellWidth(), m_buttonGrid->cellHeight()));

    Button::onClicked.connect(m_closeButton, handler);

    return root;
}